

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  ImVector<ImGuiWindow_*> *in_RSI;
  uint *in_RDI;
  int i;
  void *unaff_retaddr;
  char *in_stack_00000060;
  ImGuiWindow *in_stack_00000068;
  int i_00;
  
  bVar1 = TreeNode((char *)in_RSI,"%s (%d)",in_RSI,(ulong)*in_RDI);
  if (bVar1) {
    for (i_00 = 0; i_00 < (int)*in_RDI; i_00 = i_00 + 1) {
      ImVector<ImGuiWindow_*>::operator[](in_RSI,i_00);
      PushID(unaff_retaddr);
      ImVector<ImGuiWindow_*>::operator[](in_RSI,i_00);
      NodeWindow(in_stack_00000068,in_stack_00000060);
      PopID();
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
            {
                ImGui::PushID(windows[i]);
                Funcs::NodeWindow(windows[i], "Window");
                ImGui::PopID();
            }
            ImGui::TreePop();
        }